

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.h
# Opt level: O0

string * __thiscall
pstack::stringify<char_const(&)[16],pstack::Dwarf::Tag,char_const(&)[2]>
          (string *__return_storage_ptr__,pstack *this,char (*things) [16],Tag *things_1,
          char (*things_2) [2])

{
  ostream *poVar1;
  ostringstream local_1a0 [8];
  ostringstream stream;
  char (*things_local_2) [2];
  Tag *things_local_1;
  char (*things_local) [16];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,(char *)this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)*things);
  std::operator<<(poVar1,(char *)things_1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string
stringify(Stuff&&... things)
{
    std::ostringstream stream;
    ( stream <<  ... << things );
    return stream.str();
}